

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_pattern_from_file
                  (archive_match *a,match_list *mlist,wchar_t mbs,void *pathname,
                  wchar_t nullSeparator)

{
  bool bVar1;
  char *_p;
  wchar_t wVar2;
  archive *_a;
  ulong uStack_98;
  wchar_t found_separator;
  size_t length;
  char *s;
  char *b;
  wchar_t r;
  int64_t offset;
  size_t size;
  void *buff;
  archive_string as;
  archive_entry *ae;
  archive *ar;
  wchar_t nullSeparator_local;
  void *pathname_local;
  wchar_t mbs_local;
  match_list *mlist_local;
  archive_match *a_local;
  
  _a = archive_read_new();
  if (_a == (archive *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    archive_read_support_format_raw(_a);
    a_local._4_4_ = archive_read_support_format_empty(_a);
    if (a_local._4_4_ == L'\0') {
      if (mbs == L'\0') {
        b._4_4_ = archive_read_open_filename_w(_a,(wchar_t *)pathname,0x2800);
      }
      else {
        b._4_4_ = archive_read_open_filename(_a,(char *)pathname,0x2800);
      }
      if (b._4_4_ == L'\0') {
        a_local._4_4_ = archive_read_next_header(_a,(archive_entry **)&as.buffer_length);
        if (a_local._4_4_ == L'\0') {
          buff = (void *)0x0;
          as.s = (char *)0x0;
          as.length = 0;
LAB_00160e3e:
          a_local._4_4_ =
               archive_read_data_block
                         (_a,(void **)&size,(size_t *)&offset,(la_int64_t *)&stack0xffffffffffffff88
                         );
          if (a_local._4_4_ == L'\0') {
            s = (char *)size;
            while (_p = s, offset != 0) {
              bVar1 = false;
              for (uStack_98 = 0; uStack_98 < (ulong)offset; uStack_98 = uStack_98 + 1) {
                if (nullSeparator == L'\0') {
                  if ((*s == '\r') || (*s == '\n')) {
                    bVar1 = true;
                    break;
                  }
                }
                else if (*s == '\0') {
                  bVar1 = true;
                  break;
                }
                s = s + 1;
              }
              if (!bVar1) {
                archive_strncat((archive_string *)&buff,_p,uStack_98);
                break;
              }
              s = s + 1;
              offset = offset - (uStack_98 + 1);
              archive_strncat((archive_string *)&buff,_p,uStack_98);
              if (as.s != (char *)0x0) {
                wVar2 = add_pattern_mbs(a,mlist,(char *)buff);
                if (wVar2 != L'\0') {
                  archive_read_free(_a);
                  archive_string_free((archive_string *)&buff);
                  return wVar2;
                }
                as.s = (char *)0x0;
              }
            }
            goto LAB_00160e3e;
          }
          if (a_local._4_4_ < L'\0') {
            archive_copy_error(&a->archive,_a);
            archive_read_free(_a);
            archive_string_free((archive_string *)&buff);
          }
          else if (((a_local._4_4_ == L'\x01') && (as.s != (char *)0x0)) &&
                  (a_local._4_4_ = add_pattern_mbs(a,mlist,(char *)buff), a_local._4_4_ != L'\0')) {
            archive_read_free(_a);
            archive_string_free((archive_string *)&buff);
          }
          else {
            archive_read_free(_a);
            archive_string_free((archive_string *)&buff);
            a_local._4_4_ = L'\0';
          }
        }
        else {
          archive_read_free(_a);
          if (a_local._4_4_ == L'\x01') {
            a_local._4_4_ = L'\0';
          }
          else {
            archive_copy_error(&a->archive,_a);
          }
        }
      }
      else {
        archive_copy_error(&a->archive,_a);
        archive_read_free(_a);
        a_local._4_4_ = b._4_4_;
      }
    }
    else {
      archive_copy_error(&a->archive,_a);
      archive_read_free(_a);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
add_pattern_from_file(struct archive_match *a, struct match_list *mlist,
    int mbs, const void *pathname, int nullSeparator)
{
	struct archive *ar;
	struct archive_entry *ae;
	struct archive_string as;
	const void *buff;
	size_t size;
	int64_t offset;
	int r;

	ar = archive_read_new(); 
	if (ar == NULL) {
		archive_set_error(&(a->archive), ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	r = archive_read_support_format_raw(ar);
	r = archive_read_support_format_empty(ar);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	if (mbs)
		r = archive_read_open_filename(ar, pathname, 512*20);
	else
		r = archive_read_open_filename_w(ar, pathname, 512*20);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	r = archive_read_next_header(ar, &ae);
	if (r != ARCHIVE_OK) {
		archive_read_free(ar);
		if (r == ARCHIVE_EOF) {
			return (ARCHIVE_OK);
		} else {
			archive_copy_error(&(a->archive), ar);
			return (r);
		}
	}

	archive_string_init(&as);

	while ((r = archive_read_data_block(ar, &buff, &size, &offset))
	    == ARCHIVE_OK) {
		const char *b = (const char *)buff;

		while (size) {
			const char *s = (const char *)b;
			size_t length = 0;
			int found_separator = 0;

			while (length < size) {
				if (nullSeparator) {
					if (*b == '\0') {
						found_separator = 1;
						break;
					}
				} else {
			            	if (*b == 0x0d || *b == 0x0a) {
						found_separator = 1;
						break;
					}
				}
				b++;
				length++;
			}
			if (!found_separator) {
				archive_strncat(&as, s, length);
				/* Read next data block. */
				break;
			}
			b++;
			size -= length + 1;
			archive_strncat(&as, s, length);

			/* If the line is not empty, add the pattern. */
			if (archive_strlen(&as) > 0) {
				/* Add pattern. */
				r = add_pattern_mbs(a, mlist, as.s);
				if (r != ARCHIVE_OK) {
					archive_read_free(ar);
					archive_string_free(&as);
					return (r);
				}
				archive_string_empty(&as);
			}
		}
	}

	/* If an error occurred, report it immediately. */
	if (r < ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		archive_string_free(&as);
		return (r);
	}

	/* If the line is not empty, add the pattern. */
	if (r == ARCHIVE_EOF && archive_strlen(&as) > 0) {
		/* Add pattern. */
		r = add_pattern_mbs(a, mlist, as.s);
		if (r != ARCHIVE_OK) {
			archive_read_free(ar);
			archive_string_free(&as);
			return (r);
		}
	}
	archive_read_free(ar);
	archive_string_free(&as);
	return (ARCHIVE_OK);
}